

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O0

size_t nghttp2_hd_huff_encode_count(uint8_t *src,size_t len)

{
  long local_28;
  size_t nbits;
  size_t i;
  size_t len_local;
  uint8_t *src_local;
  
  local_28 = 0;
  for (nbits = 0; nbits < len; nbits = nbits + 1) {
    local_28 = (ulong)huff_sym_table[src[nbits]].nbits + local_28;
  }
  return local_28 + 7U >> 3;
}

Assistant:

size_t nghttp2_hd_huff_encode_count(const uint8_t *src, size_t len) {
  size_t i;
  size_t nbits = 0;

  for (i = 0; i < len; ++i) {
    nbits += huff_sym_table[src[i]].nbits;
  }
  /* pad the prefix of EOS (256) */
  return (nbits + 7) / 8;
}